

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetDefaults(void *arkode_mem)

{
  long in_RDI;
  int retval;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x34,"ARKodeSetDefaults",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if ((*(long *)(in_RDI + 0xe0) == 0) ||
          (local_4 = (**(code **)(in_RDI + 0xe0))(in_RDI), local_4 == 0)) {
    *(undefined4 *)(in_RDI + 0x3d0) = 0;
    *(undefined4 *)(in_RDI + 0x2e0) = 0;
    *(undefined8 *)(in_RDI + 0x20) = 0x3f1a36e2eb1c432d;
    *(undefined4 *)(in_RDI + 0x18) = 0;
    *(undefined4 *)(in_RDI + 0x1c) = 0;
    *(undefined8 *)(in_RDI + 0x28) = 0x3e112e0be826d695;
    *(undefined4 *)(in_RDI + 0x38) = 0;
    *(undefined8 *)(in_RDI + 0x40) = 0x3e112e0be826d695;
    *(undefined4 *)(in_RDI + 0x50) = 0;
    *(undefined4 *)(in_RDI + 0x54) = 0;
    *(code **)(in_RDI + 0x58) = arkEwtSetSS;
    *(long *)(in_RDI + 0x60) = in_RDI;
    *(undefined4 *)(in_RDI + 0x68) = 0;
    *(code **)(in_RDI + 0x70) = arkRwtSet;
    *(long *)(in_RDI + 0x78) = in_RDI;
    *(undefined8 *)(in_RDI + 0x2f0) = 500;
    *(undefined4 *)(in_RDI + 0x2f8) = 10;
    *(undefined4 *)(in_RDI + 0x300) = 7;
    *(undefined4 *)(in_RDI + 0x304) = 10;
    *(undefined4 *)(in_RDI + 0x2fc) = 10;
    *(undefined8 *)(in_RDI + 0x298) = 0;
    *(undefined8 *)(in_RDI + 0x2a8) = 0;
    *(undefined8 *)(in_RDI + 0x2b0) = 0;
    *(undefined4 *)(in_RDI + 0x288) = 0;
    *(undefined4 *)(in_RDI + 0x28c) = 0;
    *(undefined8 *)(in_RDI + 0x290) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 8) = 0x40c3880000000000;
    *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x10) = 0x3fd3333333333333;
    *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x18) = 0x3fb999999999999a;
    *(undefined4 *)(*(long *)(in_RDI + 0x2e8) + 0x20) = 2;
    *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x28) = 0x3fd0000000000000;
    *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x30) = 0x3fe0000000000000;
    *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x38) = 0x3feeb851eb851eb8;
    *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x40) = 0x4034000000000000;
    *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x48) = 0x3ff0000000000000;
    *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x50) = 0x3ff8000000000000;
    *(code **)(*(long *)(in_RDI + 0x2e8) + 0x78) = arkExpStab;
    *(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x80) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0x2e8) + 0x60) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0x2e8) + 0x58) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0x2e8) + 0x5c) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0x2e8) + 100) = 0xffffffff;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ARKodeSetDefaults(void* arkode_mem)
{
  ARKodeMem ark_mem;
  int retval;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Set stepper defaults (if provided) */
  if (ark_mem->step_setdefaults)
  {
    retval = ark_mem->step_setdefaults(arkode_mem);
    if (retval != ARK_SUCCESS) { return retval; }
  }

  /* Set default values for integrator optional inputs */
  ark_mem->use_compensated_sums = SUNFALSE;
  ark_mem->fixedstep            = SUNFALSE; /* default to use adaptive steps */
  ark_mem->reltol               = SUN_RCONST(1.e-4); /* relative tolerance */
  ark_mem->itol      = ARK_SS; /* scalar-scalar solution tolerances */
  ark_mem->ritol     = ARK_SS; /* scalar-scalar residual tolerances */
  ark_mem->Sabstol   = SUN_RCONST(1.e-9); /* solution absolute tolerance */
  ark_mem->atolmin0  = SUNFALSE;          /* min(abstol) > 0 */
  ark_mem->SRabstol  = SUN_RCONST(1.e-9); /* residual absolute tolerance */
  ark_mem->Ratolmin0 = SUNFALSE;          /* min(Rabstol) > 0 */
  ark_mem->user_efun = SUNFALSE;          /* no user-supplied ewt function */
  ark_mem->efun      = arkEwtSetSS;    /* built-in scalar-scalar ewt function */
  ark_mem->e_data    = ark_mem;        /* ewt function data */
  ark_mem->user_rfun = SUNFALSE;       /* no user-supplied rwt function */
  ark_mem->rfun      = arkRwtSet;      /* built-in rwt function */
  ark_mem->r_data    = ark_mem;        /* rwt function data */
  ark_mem->mxstep    = MXSTEP_DEFAULT; /* max number of steps */
  ark_mem->mxhnil    = MXHNIL;         /* max warns of t+h==t */
  ark_mem->maxnef    = MAXNEF;         /* max error test fails */
  ark_mem->maxncf    = MAXNCF;         /* max convergence fails */
  ark_mem->maxconstrfails = MAXCONSTRFAILS; /* max number of constraint fails */
  ark_mem->hin            = ZERO;       /* determine initial step on-the-fly */
  ark_mem->hmin           = ZERO;       /* no minimum step size */
  ark_mem->hmax_inv       = ZERO;       /* no maximum step size */
  ark_mem->tstopset       = SUNFALSE;   /* no stop time set */
  ark_mem->tstopinterp    = SUNFALSE;   /* copy at stop time */
  ark_mem->tstop          = ZERO;       /* no fixed stop time */
  ark_mem->hadapt_mem->etamx1 = ETAMX1; /* max change on first step */
  ark_mem->hadapt_mem->etamxf = ETAMXF; /* max change on error-failed step */
  ark_mem->hadapt_mem->etamin = ETAMIN; /* min bound on time step reduction */
  ark_mem->hadapt_mem->small_nef =
    SMALL_NEF; /* num error fails before ETAMXF enforced */
  ark_mem->hadapt_mem->etacf  = ETACF;  /* max change on convergence failure */
  ark_mem->hadapt_mem->cfl    = CFLFAC; /* explicit stability factor */
  ark_mem->hadapt_mem->safety = SAFETY; /* step adaptivity safety factor  */
  ark_mem->hadapt_mem->growth = GROWTH; /* step adaptivity growth factor */
  ark_mem->hadapt_mem->lbound = HFIXED_LB; /* step adaptivity no-change lower bound */
  ark_mem->hadapt_mem->ubound = HFIXED_UB; /* step adaptivity no-change upper bound */
  ark_mem->hadapt_mem->expstab = arkExpStab; /* internal explicit stability fn */
  ark_mem->hadapt_mem->estab_data = NULL;    /* no explicit stability fn data */
  ark_mem->hadapt_mem->pq         = PQ;      /* embedding order */
  ark_mem->hadapt_mem->p          = 0;       /* no default embedding order */
  ark_mem->hadapt_mem->q          = 0;       /* no default method order */
  ark_mem->hadapt_mem->adjust     = ADJUST;  /* controller order adjustment */
  return (ARK_SUCCESS);
}